

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

Mat * ncnn::Mat::from_float16(Mat *__return_storage_ptr__,unsigned_short *data,int size)

{
  void *pvVar1;
  uint uVar2;
  long lVar3;
  float fVar4;
  
  __return_storage_ptr__->cstep = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->d = 0;
  __return_storage_ptr__->c = 0;
  create(__return_storage_ptr__,size,4,(Allocator *)0x0);
  pvVar1 = __return_storage_ptr__->data;
  if ((pvVar1 != (void *)0x0) &&
     (0 < size && (long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
    uVar2 = size + 1;
    lVar3 = 0;
    do {
      fVar4 = float16_to_float32(*(unsigned_short *)((long)data + lVar3));
      *(float *)((long)pvVar1 + lVar3 * 2) = fVar4;
      uVar2 = uVar2 - 1;
      lVar3 = lVar3 + 2;
    } while (1 < uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_float16(const unsigned short* data, int size)
{
    Mat m(size);
    if (m.empty())
        return m;

    float* ptr = m; //.data;

#if __ARM_NEON && (__ARM_FP & 2)
    int nn = cpu_support_arm_vfpv4() ? size >> 2 : 0;
    int remain = size - (nn << 2);
#else
    int remain = size;
#endif // __ARM_NEON

#if __ARM_NEON && (__ARM_FP & 2)
#if __aarch64__
    if (nn > 0)
    {
        asm volatile(
            "0:                             \n"
            "ld1    {v0.4h}, [%1], #8       \n"
            "fcvtl  v1.4s, v0.4h            \n"
            "subs   %w0, %w0, #1            \n"
            "st1    {v1.4s}, [%2], #16      \n"
            "bne    0b                      \n"
            : "=r"(nn),   // %0
            "=r"(data), // %1
            "=r"(ptr)   // %2
            : "0"(nn),
            "1"(data),
            "2"(ptr)
            : "cc", "memory", "v0", "v1");
    }
#else
    if (nn > 0)
    {
        asm volatile(
            "0:                             \n"
            "pld        [%1, #64]           \n"
            "vld1.s16   {d0}, [%1 :64]!     \n"
            "vcvt.f32.f16 q1, d0            \n"
            "subs       %0, #1              \n"
            "vst1.f32   {d2-d3}, [%2 :128]! \n"
            "bne        0b                  \n"
            : "=r"(nn),   // %0
            "=r"(data), // %1
            "=r"(ptr)   // %2
            : "0"(nn),
            "1"(data),
            "2"(ptr)
            : "cc", "memory", "q0", "q1");
    }
#endif // __aarch64__
#endif // __ARM_NEON
    for (; remain > 0; remain--)
    {
        *ptr = float16_to_float32(*data);

        data++;
        ptr++;
    }

    return m;
}